

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void __thiscall
CVmObjBigNum::restore_from_file
          (CVmObjBigNum *this,vm_obj_id_t param_1,CVmFile *fp,CVmObjFixup *param_3)

{
  uint uVar1;
  uint16_t tmp;
  
  uVar1 = CVmFile::read_uint2(fp);
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObject).ext_ = (char *)0x0;
  }
  alloc_bignum(this,(ulong)uVar1);
  *(short *)(this->super_CVmObject).ext_ = (short)uVar1;
  CVmFile::read_bytes(fp,(this->super_CVmObject).ext_ + 2,((ulong)uVar1 + 1 >> 1) + 3);
  return;
}

Assistant:

void CVmObjBigNum::restore_from_file(VMG_ vm_obj_id_t,
                                     CVmFile *fp, CVmObjFixup *)
{
    size_t prec;
    
    /* read the precision */
    prec = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space */
    alloc_bignum(vmg_ prec);

    /* store our precision */
    set_prec(ext_, prec);

    /* read the contents */
    fp->read_bytes(ext_ + VMBN_EXP, calc_alloc(prec) - VMBN_EXP);
}